

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

void __thiscall QList<QRegularExpression>::reserve(QList<QRegularExpression> *this,qsizetype asize)

{
  bool bVar1;
  qsizetype qVar2;
  qsizetype qVar3;
  QGenericArrayOps<QRegularExpression> *this_00;
  Data *pDVar4;
  long in_RSI;
  QArrayDataPointer<QRegularExpression> *in_RDI;
  long in_FS_OFFSET;
  DataPointer detached;
  undefined4 in_stack_ffffffffffffff58;
  QFlagsStorage<QArrayData::ArrayOption> in_stack_ffffffffffffff5c;
  QArrayDataPointer<QRegularExpression> *in_stack_ffffffffffffff60;
  QArrayDataPointer<QRegularExpression> *in_stack_ffffffffffffff68;
  QArrayDataPointer<QRegularExpression> *this_01;
  qsizetype in_stack_ffffffffffffff70;
  qsizetype in_stack_ffffffffffffff78;
  QArrayDataPointer<QRegularExpression> *in_stack_ffffffffffffff80;
  qsizetype local_40;
  QArrayDataPointer<QRegularExpression> local_38;
  QFlagsStorageHelper<QArrayData::ArrayOption,_4> local_18;
  QFlagsStorageHelper<QArrayData::ArrayOption,_4> local_14;
  longlong local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  qVar2 = capacity((QList<QRegularExpression> *)0x2963d5);
  qVar3 = QArrayDataPointer<QRegularExpression>::freeSpaceAtBegin(in_stack_ffffffffffffff68);
  if (in_RSI <= qVar2 - qVar3) {
    QArrayDataPointer<QRegularExpression>::operator->(in_RDI);
    local_18.super_QFlagsStorage<QArrayData::ArrayOption>.i =
         (QFlagsStorage<QArrayData::ArrayOption>)
         QArrayDataPointer<QRegularExpression>::flags(in_stack_ffffffffffffff60);
    local_14.super_QFlagsStorage<QArrayData::ArrayOption>.i =
         (QFlagsStorage<QArrayData::ArrayOption>)
         QFlags<QArrayData::ArrayOption>::operator&
                   ((QFlags<QArrayData::ArrayOption> *)in_stack_ffffffffffffff60,
                    in_stack_ffffffffffffff5c.i);
    bVar1 = ::QFlags::operator_cast_to_bool((QFlags *)&local_14);
    if (bVar1) goto LAB_002965b1;
    QArrayDataPointer<QRegularExpression>::operator->(in_RDI);
    bVar1 = QArrayDataPointer<QRegularExpression>::isShared(in_stack_ffffffffffffff60);
    if (!bVar1) {
      QArrayDataPointer<QRegularExpression>::operator->(in_RDI);
      QFlags<QArrayData::ArrayOption>::QFlags
                ((QFlags<QArrayData::ArrayOption> *)in_stack_ffffffffffffff60,
                 in_stack_ffffffffffffff5c.i);
      QArrayDataPointer<QRegularExpression>::setFlag
                ((QArrayDataPointer<QRegularExpression> *)0x29648f,
                 (ArrayOptions)in_stack_ffffffffffffff5c.i);
      goto LAB_002965b1;
    }
  }
  local_38.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_38.ptr = (QRegularExpression *)&DAT_aaaaaaaaaaaaaaaa;
  local_38.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_40 = size((QList<QRegularExpression> *)in_RDI);
  qMax<long_long>(&local_10,&local_40);
  this_01 = &local_38;
  QArrayDataPointer<QRegularExpression>::QArrayDataPointer
            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
             (AllocationOption)((ulong)this_01 >> 0x20));
  this_00 = (QGenericArrayOps<QRegularExpression> *)
            QArrayDataPointer<QRegularExpression>::operator->(this_01);
  QArrayDataPointer<QRegularExpression>::operator->(in_RDI);
  QArrayDataPointer<QRegularExpression>::begin((QArrayDataPointer<QRegularExpression> *)0x296511);
  QArrayDataPointer<QRegularExpression>::operator->(in_RDI);
  QArrayDataPointer<QRegularExpression>::end(in_stack_ffffffffffffff60);
  QtPrivate::QGenericArrayOps<QRegularExpression>::copyAppend
            (this_00,(QRegularExpression *)this_01,(QRegularExpression *)in_stack_ffffffffffffff60);
  pDVar4 = QArrayDataPointer<QRegularExpression>::d_ptr(&local_38);
  if (pDVar4 != (Data *)0x0) {
    in_stack_ffffffffffffff60 =
         (QArrayDataPointer<QRegularExpression> *)
         QArrayDataPointer<QRegularExpression>::operator->(&local_38);
    QFlags<QArrayData::ArrayOption>::QFlags
              ((QFlags<QArrayData::ArrayOption> *)in_stack_ffffffffffffff60,
               in_stack_ffffffffffffff5c.i);
    QArrayDataPointer<QRegularExpression>::setFlag
              ((QArrayDataPointer<QRegularExpression> *)0x296578,
               (ArrayOptions)in_stack_ffffffffffffff5c.i);
  }
  QArrayDataPointer<QRegularExpression>::swap
            (in_stack_ffffffffffffff60,
             (QArrayDataPointer<QRegularExpression> *)
             CONCAT44(in_stack_ffffffffffffff5c.i,in_stack_ffffffffffffff58));
  QArrayDataPointer<QRegularExpression>::~QArrayDataPointer(in_stack_ffffffffffffff60);
LAB_002965b1:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QList<T>::reserve(qsizetype asize)
{
    // capacity() == 0 for immutable data, so this will force a detaching below
    if (asize <= capacity() - d.freeSpaceAtBegin()) {
        if (d->flags() & Data::CapacityReserved)
            return;  // already reserved, don't shrink
        if (!d->isShared()) {
            // accept current allocation, don't shrink
            d->setFlag(Data::CapacityReserved);
            return;
        }
    }

    DataPointer detached(qMax(asize, size()));
    detached->copyAppend(d->begin(), d->end());
    if (detached.d_ptr())
        detached->setFlag(Data::CapacityReserved);
    d.swap(detached);
}